

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsondocument.cpp
# Opt level: O2

QDebug operator<<(QDebug dbg,QJsonDocument *o)

{
  _Head_base<0UL,_QJsonDocumentPrivate_*,_false> _Var1;
  QDebug *pQVar2;
  undefined8 *in_RDX;
  char *t;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_68;
  QDebugStateSaver saver;
  QJsonValue local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  saver.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)o);
  if ((QCborValue *)*in_RDX == (QCborValue *)0x0) {
    QDebug::operator<<((QDebug *)o,"QJsonDocument()");
    _Var1._M_head_impl =
         (o->d)._M_t.
         super___uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>.
         _M_t.
         super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>.
         super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl;
    (o->d)._M_t.
    super___uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>._M_t.
    super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>.
    super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl = (QJsonDocumentPrivate *)0x0;
    ((dbg.stream)->ts)._vptr_QTextStream = (_func_int **)_Var1._M_head_impl;
  }
  else {
    local_68.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.ptr = &DAT_aaaaaaaaaaaaaaaa;
    QJsonPrivate::Value::fromTrustedCbor(&local_40,(QCborValue *)*in_RDX);
    QJsonValue::toJson((QByteArray *)&local_68,&local_40,Compact);
    QJsonValue::~QJsonValue(&local_40);
    *(undefined1 *)
     &(o->d)._M_t.
      super___uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>._M_t.
      super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>.
      super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl[2].value = 0;
    pQVar2 = QDebug::operator<<((QDebug *)o,"QJsonDocument(");
    t = local_68.ptr;
    if (local_68.ptr == (char *)0x0) {
      t = &QByteArray::_empty;
    }
    pQVar2 = QDebug::operator<<(pQVar2,t);
    QDebug::operator<<(pQVar2,')');
    _Var1._M_head_impl =
         (o->d)._M_t.
         super___uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>.
         _M_t.
         super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>.
         super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl;
    (o->d)._M_t.
    super___uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>._M_t.
    super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>.
    super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl = (QJsonDocumentPrivate *)0x0;
    ((dbg.stream)->ts)._vptr_QTextStream = (_func_int **)_Var1._M_head_impl;
    QArrayDataPointer<char>::~QArrayDataPointer(&local_68);
  }
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (QDebug)dbg.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QJsonDocument &o)
{
    QDebugStateSaver saver(dbg);
    if (!o.d) {
        dbg << "QJsonDocument()";
        return dbg;
    }
    QByteArray json =
        QJsonPrivate::Value::fromTrustedCbor(o.d->value).toJson(QJsonValue::JsonFormat::Compact);
    dbg.nospace() << "QJsonDocument("
                  << json.constData() // print as utf-8 string without extra quotation marks
                  << ')';
    return dbg;
}